

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitMethodFld(ParseNode *pnode,RegSlot callObjLocation,PropertyId propertyId,
                  ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
                  bool registerCacheIdForCall)

{
  bool isRoot;
  ParseNodeName *pPVar1;
  bool isScoped;
  
  if (pnode->nop == knopName) {
    pPVar1 = ParseNode::AsParseNodeName(pnode);
    if (pPVar1->sym == (Symbol *)0x0) {
      isRoot = true;
    }
    else {
      pPVar1 = ParseNode::AsParseNodeName(pnode);
      isRoot = (bool)((pPVar1->sym->field_0x42 & 8) >> 3);
    }
  }
  else {
    isRoot = false;
  }
  isScoped = true;
  if ((byteCodeGenerator->flags & 0x400) == 0) {
    isScoped = (bool)(callObjLocation != 0xfffffffd & isRoot);
  }
  EmitMethodFld(isRoot,isScoped,pnode->location,callObjLocation,propertyId,byteCodeGenerator,
                funcInfo,registerCacheIdForCall);
  return;
}

Assistant:

void EmitMethodFld(ParseNode *pnode, Js::RegSlot callObjLocation, Js::PropertyId propertyId, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo, bool registerCacheIdForCall = true)
{
    // Load a call target of the form x.y(). (Call target may be a plain knopName if we're getting it from
    // the global object, etc.)
    bool isRoot = pnode->nop == knopName && (pnode->AsParseNodeName()->sym == nullptr || pnode->AsParseNodeName()->sym->GetIsGlobal());
    bool isScoped = (byteCodeGenerator->GetFlags() & fscrEval) != 0 ||
        (isRoot && callObjLocation != ByteCodeGenerator::RootObjectRegister);

    EmitMethodFld(isRoot, isScoped, pnode->location, callObjLocation, propertyId, byteCodeGenerator, funcInfo, registerCacheIdForCall);
}